

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labpack-status.c
# Opt level: O3

int labpack_status_code(labpack_status_t status)

{
  int iVar1;
  
  iVar1 = 1;
  if (status < (LABPACK_STATUS_ERROR_DECODER|LABPACK_STATUS_ERROR_OUT_OF_MEMORY)) {
    iVar1 = -status;
  }
  return iVar1;
}

Assistant:

int
labpack_status_code(labpack_status_t status) {
    switch (status) {
        case LABPACK_STATUS_OK: return 0;
        case LABPACK_STATUS_ERROR_OUT_OF_MEMORY: return -1;
        case LABPACK_STATUS_ERROR_NULL_VALUE: return -2;                                     
        case LABPACK_STATUS_ERROR_ENCODER: return -3;
        case LABPACK_STATUS_ERROR_DECODER: return -4;
        default: assert(UNKNOWN_STATUS);
    }
    return 1;
}